

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O0

bool flow::lang::TokenTraits::isType(Token t)

{
  Token t_local;
  
  return t - VoidType < 4;
}

Assistant:

bool TokenTraits::isType(Token t) {
  switch (t) {
    case Token::VoidType:
    case Token::BoolType:
    case Token::NumberType:
    case Token::StringType:
      return true;
    default:
      return false;
  }
}